

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O1

size_t __thiscall
pstack::Procman::CoreProcess::getRegs
          (CoreProcess *this,lwpid_t lwpid,int code,size_t size,void *data)

{
  _Rb_tree_header *p_Var1;
  pointer pNVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  bool bVar10;
  long *local_1c8;
  elf_prstatus prstatus;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Reader *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  size_t local_48;
  void *local_40;
  int local_34;
  
  p_Var1 = &(this->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header;
  p_Var8 = (this->lwpToPrStatusIdx)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var9 = &p_Var1->_M_header;
  for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < lwpid]) {
    if (lwpid <= (int)p_Var8[1]._M_color) {
      p_Var9 = p_Var8;
    }
  }
  p_Var8 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var9 != p_Var1) && (p_Var8 = p_Var9, lwpid < (int)p_Var9[1]._M_color)) {
    p_Var8 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    p_Var8 = p_Var8[1]._M_parent;
    lVar6 = (long)p_Var8 * 0x20;
    local_48 = size;
    local_40 = data;
    local_34 = code;
    do {
      p_Var8 = (_Base_ptr)((long)&p_Var8->_M_color + 1);
      pNVar2 = (this->notes).
               super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)&(pNVar2->note).n_type + lVar6) == code) {
        if (code == 1) {
          pstack::Elf::NoteDesc::data();
          Reader::readObj<elf_prstatus>(local_58,0,(elf_prstatus *)&local_1c8,1);
          sVar7 = local_48;
          if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
          }
          if (0xd7 < sVar7) {
            sVar7 = 0xd8;
          }
          memcpy(local_40,&prstatus.pr_cstime.tv_usec,sVar7);
          return sVar7;
        }
        pstack::Elf::NoteDesc::data();
        uVar5 = (**(code **)(*local_1c8 + 0x40))();
        sVar7 = local_48;
        if (uVar5 < local_48) {
          sVar7 = uVar5;
        }
        if (prstatus.pr_info._0_8_ != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)prstatus.pr_info._0_8_);
        }
        pstack::Elf::NoteDesc::data();
        (**(code **)(*local_1c8 + 0x10))(local_1c8,0,sVar7,local_40);
        if (prstatus.pr_info._0_8_ == 0) {
          return sVar7;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)prstatus.pr_info._0_8_);
        return sVar7;
      }
      if (p_Var8 == (_Base_ptr)
                    ((long)(this->notes).
                           super__Vector_base<pstack::Elf::NoteDesc,_std::allocator<pstack::Elf::NoteDesc>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2 >> 5)) {
        bVar10 = true;
        bVar3 = false;
      }
      else if (*(int *)((long)&pNVar2[1].note.n_type + lVar6) == 1) {
        pstack::Elf::NoteDesc::name_abi_cxx11_();
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &prstatus.pr_fpvalid,"CORE");
        bVar10 = iVar4 == 0;
        bVar3 = true;
        code = local_34;
      }
      else {
        bVar3 = false;
        bVar10 = false;
      }
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)prstatus._328_8_ != &local_68)) {
        operator_delete((void *)prstatus._328_8_,local_68._M_allocated_capacity + 1);
        code = local_34;
      }
      lVar6 = lVar6 + 0x20;
    } while (!bVar10);
  }
  return 0;
}

Assistant:

size_t
CoreProcess::getRegs(lwpid_t lwpid, int code, size_t size, void *data)
{
   auto idx = lwpToPrStatusIdx.find( lwpid );
   if ( idx == lwpToPrStatusIdx.end() ) {
      return 0;
   }
   for (size_t i = idx->second;;) {
      if (notes[i].type() == code) {
         if (code == NT_PRSTATUS) {
            auto prstatus = notes[i].data()->readObj<prstatus_t>(0);
            size = std::min(size, sizeof prstatus.pr_reg);
            memcpy(data, &prstatus.pr_reg, size);
         } else {
            size = std::min(size, size_t(notes[i].data()->size()));
            notes[i].data()->read(0, size, reinterpret_cast<char *>(data));
         }
         return size;
      }
      ++i;
      if (i == notes.size() || ( notes[i].type() == NT_PRSTATUS && notes[i].name() == "CORE") ) {
         // We're done if that's all the notes, or the next note is the start of a new LWP.
         break;
      }
   }
   return 0;
}